

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_cert_chain(X509_STORE *store,X509 *cert,stack_st_X509 *chain,int is_server,
                     char *server_name)

{
  int iVar1;
  X509_STORE_CTX *ctx;
  size_t sVar2;
  int local_3c;
  int x509_err;
  int ret;
  X509_STORE_CTX *verify_ctx;
  char *server_name_local;
  int is_server_local;
  stack_st_X509 *chain_local;
  X509 *cert_local;
  X509_STORE *store_local;
  
  if (server_name == (char *)0x0) {
    __assert_fail("server_name != NULL && \"ptls_set_server_name MUST be called\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                  ,0x4cd,
                  "int verify_cert_chain(X509_STORE *, X509 *, struct stack_st_X509 *, int, const char *)"
                 );
  }
  ctx = X509_STORE_CTX_new();
  if (ctx == (X509_STORE_CTX *)0x0) {
    local_3c = 0x201;
  }
  else {
    iVar1 = X509_STORE_CTX_init(ctx,(X509_STORE *)store,(X509 *)cert,(stack_st_X509 *)chain);
    if (iVar1 == 1) {
      iVar1 = 1;
      if (is_server != 0) {
        iVar1 = 2;
      }
      X509_STORE_CTX_set_purpose(ctx,iVar1);
      iVar1 = X509_verify_cert(ctx);
      if (iVar1 == 1) {
        if (server_name != (char *)0x0) {
          iVar1 = ptls_server_name_is_ipaddr(server_name);
          if (iVar1 == 0) {
            sVar2 = strlen(server_name);
            local_3c = X509_check_host(cert,server_name,sVar2,4,0);
          }
          else {
            local_3c = X509_check_ip_asc(cert,server_name,0);
          }
          if (local_3c != 1) {
            if (local_3c == 0) {
              local_3c = 0x2a;
            }
            else {
              local_3c = 0x203;
            }
            goto LAB_0013d226;
          }
        }
        local_3c = 0;
      }
      else {
        iVar1 = X509_STORE_CTX_get_error(ctx);
        switch(iVar1) {
        case 2:
        case 0x14:
        case 0x1b:
        case 0x1c:
          local_3c = 0x30;
          break;
        default:
          local_3c = 0x2e;
          break;
        case 9:
        case 10:
          local_3c = 0x2d;
          break;
        case 0x11:
          local_3c = 0x201;
          break;
        case 0x17:
          local_3c = 0x2c;
          break;
        case 0x4f:
          local_3c = 0x2a;
        }
      }
    }
    else {
      local_3c = 0x203;
    }
  }
LAB_0013d226:
  if (ctx != (X509_STORE_CTX *)0x0) {
    X509_STORE_CTX_free(ctx);
  }
  return local_3c;
}

Assistant:

static int verify_cert_chain(X509_STORE *store, X509 *cert, STACK_OF(X509) * chain, int is_server, const char *server_name)
{
    X509_STORE_CTX *verify_ctx;
    int ret;

    assert(server_name != NULL && "ptls_set_server_name MUST be called");

    /* verify certificate chain */
    if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (X509_STORE_CTX_init(verify_ctx, store, cert, chain) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    X509_STORE_CTX_set_purpose(verify_ctx, is_server ? X509_PURPOSE_SSL_SERVER : X509_PURPOSE_SSL_CLIENT);
    if (X509_verify_cert(verify_ctx) != 1) {
        int x509_err = X509_STORE_CTX_get_error(verify_ctx);
        switch (x509_err) {
        case X509_V_ERR_OUT_OF_MEM:
            ret = PTLS_ERROR_NO_MEMORY;
            break;
        case X509_V_ERR_CERT_REVOKED:
            ret = PTLS_ALERT_CERTIFICATE_REVOKED;
            break;
        case X509_V_ERR_CERT_NOT_YET_VALID:
        case X509_V_ERR_CERT_HAS_EXPIRED:
            ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
            break;
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT:
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY:
        case X509_V_ERR_CERT_UNTRUSTED:
        case X509_V_ERR_CERT_REJECTED:
            ret = PTLS_ALERT_UNKNOWN_CA;
            break;
        case X509_V_ERR_INVALID_CA:
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            break;
        default:
            ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
            break;
        }
        goto Exit;
    }

#ifdef X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS
    /* verify CN */
    if (server_name != NULL) {
        if (ptls_server_name_is_ipaddr(server_name)) {
            ret = X509_check_ip_asc(cert, server_name, 0);
        } else {
            ret = X509_check_host(cert, server_name, strlen(server_name), X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS, NULL);
        }
        if (ret != 1) {
            if (ret == 0) { /* failed match */
                ret = PTLS_ALERT_BAD_CERTIFICATE;
            } else {
                ret = PTLS_ERROR_LIBRARY;
            }
            goto Exit;
        }
    }
#else
#warning "hostname validation is disabled; OpenSSL >= 1.0.2 or LibreSSL >= 2.5.0 is required"
#endif

    ret = 0;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    return ret;
}